

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_gej *a_local;
  secp256k1_gej *r_local;
  
  r->infinity = a->infinity;
  memcpy(r,a,0x28);
  memcpy(&r->y,&a->y,0x28);
  memcpy(&r->z,&a->z,0x28);
  secp256k1_fe_normalize_weak(&r->y);
  secp256k1_fe_negate(&r->y,&r->y,1);
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
}